

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socks_connecter.cpp
# Opt level: O2

int __thiscall zmq::socks_connecter_t::connect_to_proxy(socks_connecter_t *this)

{
  void *pvVar1;
  bool bVar2;
  fd_t s_;
  socklen_t sVar3;
  int iVar4;
  tcp_address_t *ptVar5;
  address_t *paVar6;
  sockaddr *psVar7;
  int *piVar8;
  
  if ((this->super_stream_connecter_base_t)._s != -1) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","_s == retired_fd",
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/socks_connecter.cpp"
            ,0x116);
    fflush(_stderr);
    zmq_abort("_s == retired_fd");
  }
  pvVar1 = (this->_proxy_addr->resolved).dummy;
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1,0x3c);
    (this->_proxy_addr->resolved).dummy = (void *)0x0;
  }
  ptVar5 = (tcp_address_t *)operator_new(0x3c,(nothrow_t *)&std::nothrow);
  if (ptVar5 != (tcp_address_t *)0x0) {
    tcp_address_t::tcp_address_t(ptVar5);
  }
  (this->_proxy_addr->resolved).tcp_addr = ptVar5;
  paVar6 = this->_proxy_addr;
  ptVar5 = (paVar6->resolved).tcp_addr;
  if (ptVar5 == (tcp_address_t *)0x0) {
    fprintf(_stderr,"FATAL ERROR: OUT OF MEMORY (%s:%d)\n",
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/socks_connecter.cpp"
           );
    fflush(_stderr);
    zmq_abort("FATAL ERROR: OUT OF MEMORY");
    paVar6 = this->_proxy_addr;
    ptVar5 = (paVar6->resolved).tcp_addr;
  }
  s_ = tcp_open_socket((paVar6->address)._M_dataplus._M_p,
                       &(this->super_stream_connecter_base_t).super_own_t.options,false,false,ptVar5
                      );
  (this->super_stream_connecter_base_t)._s = s_;
  pvVar1 = (this->_proxy_addr->resolved).dummy;
  if (s_ == -1) {
    operator_delete(pvVar1,0x3c);
    (this->_proxy_addr->resolved).dummy = (void *)0x0;
LAB_001c7eec:
    iVar4 = -1;
  }
  else {
    if (pvVar1 == (void *)0x0) {
      fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","_proxy_addr->resolved.tcp_addr != NULL",
              "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/socks_connecter.cpp"
              ,0x129);
      fflush(_stderr);
      zmq_abort("_proxy_addr->resolved.tcp_addr != NULL");
      s_ = (this->super_stream_connecter_base_t)._s;
    }
    unblock_socket(s_);
    ptVar5 = (this->_proxy_addr->resolved).tcp_addr;
    bVar2 = tcp_address_t::has_src_addr(ptVar5);
    if (bVar2) {
      iVar4 = (this->super_stream_connecter_base_t)._s;
      psVar7 = tcp_address_t::src_addr(ptVar5);
      sVar3 = tcp_address_t::src_addrlen(ptVar5);
      iVar4 = bind(iVar4,(sockaddr *)psVar7,sVar3);
      if (iVar4 == -1) {
        stream_connecter_base_t::close(&this->super_stream_connecter_base_t,(int)psVar7);
        goto LAB_001c7eec;
      }
    }
    iVar4 = (this->super_stream_connecter_base_t)._s;
    psVar7 = tcp_address_t::addr(ptVar5);
    sVar3 = tcp_address_t::addrlen(ptVar5);
    iVar4 = connect(iVar4,(sockaddr *)psVar7,sVar3);
    if (iVar4 == 0) {
      iVar4 = 0;
    }
    else {
      piVar8 = __errno_location();
      iVar4 = -1;
      if (*piVar8 == 4) {
        *piVar8 = 0x73;
      }
    }
  }
  return iVar4;
}

Assistant:

int zmq::socks_connecter_t::connect_to_proxy ()
{
    zmq_assert (_s == retired_fd);

    //  Resolve the address
    if (_proxy_addr->resolved.tcp_addr != NULL) {
        LIBZMQ_DELETE (_proxy_addr->resolved.tcp_addr);
    }

    _proxy_addr->resolved.tcp_addr = new (std::nothrow) tcp_address_t ();
    alloc_assert (_proxy_addr->resolved.tcp_addr);
    //  Automatic fallback to ipv4 is disabled here since this was the existing
    //  behaviour, however I don't see a real reason for this. Maybe this can
    //  be changed to true (and then the parameter can be removed entirely).
    _s = tcp_open_socket (_proxy_addr->address.c_str (), options, false, false,
                          _proxy_addr->resolved.tcp_addr);
    if (_s == retired_fd) {
        //  TODO we should emit some event in this case!
        LIBZMQ_DELETE (_proxy_addr->resolved.tcp_addr);
        return -1;
    }
    zmq_assert (_proxy_addr->resolved.tcp_addr != NULL);

    // Set the socket to non-blocking mode so that we get async connect().
    unblock_socket (_s);

    const tcp_address_t *const tcp_addr = _proxy_addr->resolved.tcp_addr;

    int rc;

    // Set a source address for conversations
    if (tcp_addr->has_src_addr ()) {
#if defined ZMQ_HAVE_VXWORKS
        rc = ::bind (_s, (sockaddr *) tcp_addr->src_addr (),
                     tcp_addr->src_addrlen ());
#else
        rc = ::bind (_s, tcp_addr->src_addr (), tcp_addr->src_addrlen ());
#endif
        if (rc == -1) {
            close ();
            return -1;
        }
    }

    //  Connect to the remote peer.
#if defined ZMQ_HAVE_VXWORKS
    rc = ::connect (_s, (sockaddr *) tcp_addr->addr (), tcp_addr->addrlen ());
#else
    rc = ::connect (_s, tcp_addr->addr (), tcp_addr->addrlen ());
#endif
    //  Connect was successful immediately.
    if (rc == 0)
        return 0;

        //  Translate error codes indicating asynchronous connect has been
        //  launched to a uniform EINPROGRESS.
#ifdef ZMQ_HAVE_WINDOWS
    const int last_error = WSAGetLastError ();
    if (last_error == WSAEINPROGRESS || last_error == WSAEWOULDBLOCK)
        errno = EINPROGRESS;
    else {
        errno = wsa_error_to_errno (last_error);
        close ();
    }
#else
    if (errno == EINTR)
        errno = EINPROGRESS;
#endif
    return -1;
}